

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDD.cpp
# Opt level: O3

int64_t __thiscall HDD::Tell(HDD *this)

{
  __off64_t _Var1;
  
  _Var1 = lseek64(this->h,0,1);
  return (_Var1 - this->data_offset) / (long)this->sector_size;
}

Assistant:

int64_t HDD::Tell() const
{
#ifdef _WIN32
    int64_t llOffset = _telli64(h) - data_offset;
#else
    off_t llOffset = lseek(h, 0L, SEEK_CUR) - data_offset;
#endif
    return llOffset / sector_size;
}